

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

uint32_t getDFDNumComponents(uint32_t *DFD)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  uVar3 = 0xffffffff;
  for (lVar2 = 0; (ulong)((DFD[2] >> 0x12) - 6 >> 2) << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    uVar4 = *(byte *)((long)DFD + lVar2 + 0x1f) & 0xf;
    uVar1 = uVar1 + (uVar4 != uVar3);
    uVar3 = uVar4;
  }
  return uVar1;
}

Assistant:

uint32_t getDFDNumComponents(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t currentChannel = ~0U; /* Don't start matched. */
    uint32_t numComponents = 0;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleNumber, CHANNELID);
        if (sampleChannel != currentChannel) {
            numComponents++;
            currentChannel = sampleChannel;
        }
    }
    return numComponents;
}